

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * cmGlobalNinjaMultiGenerator::GetNinjaConfigFilename
                   (string *__return_storage_ptr__,string *config)

{
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const*&>
            (__return_storage_ptr__,(char (*) [7])0x702519,config,&NINJA_FILE_EXTENSION);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::GetNinjaConfigFilename(
  const std::string& config)
{
  return cmStrCat("build-", config,
                  cmGlobalNinjaMultiGenerator::NINJA_FILE_EXTENSION);
}